

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_materialized_collector.cpp
# Opt level: O1

unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> __thiscall
duckdb::PhysicalMaterializedCollector::GetLocalSinkState
          (PhysicalMaterializedCollector *this,ExecutionContext *context)

{
  vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_> *pvVar1;
  vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_> *pvVar2;
  MaterializedCollectorLocalState *__s;
  Allocator *allocator_p;
  ColumnDataCollection *pCVar3;
  pointer pMVar4;
  pointer this_00;
  pointer *__ptr;
  templated_unique_single_t state;
  _Head_base<0UL,_duckdb::MaterializedCollectorLocalState_*,_false> local_48;
  ColumnDataCollection *local_40;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_38;
  
  __s = (MaterializedCollectorLocalState *)operator_new(0x90);
  switchD_005700f1::default(__s,0,0x90);
  *(undefined4 *)&(__s->super_LocalSinkState).partition_info.batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(__s->super_LocalSinkState).partition_info.batch_index.index + 4) =
       0xffffffff;
  *(undefined4 *)&(__s->super_LocalSinkState).partition_info.min_batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(__s->super_LocalSinkState).partition_info.min_batch_index.index + 4) =
       0xffffffff;
  pvVar1 = &(__s->super_LocalSinkState).partition_info.partition_data.
            super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>;
  (pvVar1->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   ((long)&(__s->super_LocalSinkState).partition_info.partition_data.
           super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
           super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
           ._M_impl + 0x10) = (undefined1  [16])0x0;
  (__s->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__MaterializedCollectorLocalState_019c2ce0;
  (__s->append_state).current_chunk_state.handles._M_h._M_buckets =
       &(__s->append_state).current_chunk_state.handles._M_h._M_single_bucket;
  (__s->append_state).current_chunk_state.handles._M_h._M_bucket_count = 1;
  (__s->append_state).current_chunk_state.handles._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (__s->append_state).current_chunk_state.handles._M_h._M_element_count = 0;
  (__s->append_state).current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])
   &(__s->append_state).current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (__s->append_state).current_chunk_state.properties = INVALID;
  pvVar2 = &(__s->append_state).vector_data.
            super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>;
  (pvVar2->
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(pointer *)
   ((long)&(__s->append_state).vector_data.
           super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
           super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  local_48._M_head_impl = __s;
  allocator_p = Allocator::DefaultAllocator();
  pCVar3 = (ColumnDataCollection *)operator_new(0x70);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_38,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &context[1].pipeline);
  ColumnDataCollection::ColumnDataCollection
            (pCVar3,allocator_p,(vector<duckdb::LogicalType,_true> *)&local_38);
  local_40 = pCVar3;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_38);
  pMVar4 = unique_ptr<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>,_true>
                         *)&local_48);
  pCVar3 = local_40;
  local_40 = (ColumnDataCollection *)0x0;
  ::std::
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
           *)&pMVar4->collection,pCVar3);
  pCVar3 = local_40;
  if (local_40 != (ColumnDataCollection *)0x0) {
    ColumnDataCollection::~ColumnDataCollection(local_40);
    operator_delete(pCVar3);
  }
  pMVar4 = unique_ptr<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>,_true>
                         *)&local_48);
  this_00 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
            ::operator->(&pMVar4->collection);
  pMVar4 = unique_ptr<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedCollectorLocalState,_std::default_delete<duckdb::MaterializedCollectorLocalState>,_true>
                         *)&local_48);
  ColumnDataCollection::InitializeAppend(this_00,&pMVar4->append_state);
  (this->super_PhysicalResultCollector).super_PhysicalOperator._vptr_PhysicalOperator =
       (_func_int **)local_48._M_head_impl;
  return (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)
         (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)this;
}

Assistant:

unique_ptr<LocalSinkState> PhysicalMaterializedCollector::GetLocalSinkState(ExecutionContext &context) const {
	auto state = make_uniq<MaterializedCollectorLocalState>();
	state->collection = make_uniq<ColumnDataCollection>(Allocator::DefaultAllocator(), types);
	state->collection->InitializeAppend(state->append_state);
	return std::move(state);
}